

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowMonitor
               (GLFWwindow *wh,GLFWmonitor *mh,int xpos,int ypos,int width,int height,
               int refreshRate)

{
  _GLFWmonitor *monitor;
  _GLFWwindow *window;
  int height_local;
  int width_local;
  int ypos_local;
  int xpos_local;
  GLFWmonitor *mh_local;
  GLFWwindow *wh_local;
  
  if (wh == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                  ,0x3a9,
                  "void glfwSetWindowMonitor(GLFWwindow *, GLFWmonitor *, int, int, int, int, int)")
    ;
  }
  if (-1 < width) {
    if (-1 < height) {
      if (_glfw.initialized == 0) {
        _glfwInputError(0x10001,(char *)0x0);
      }
      else if ((width < 1) || (height < 1)) {
        _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,(ulong)(uint)height);
      }
      else if ((refreshRate < 0) && (refreshRate != -1)) {
        _glfwInputError(0x10004,"Invalid refresh rate %i",(ulong)(uint)refreshRate);
      }
      else {
        *(int *)(wh + 0x34) = width;
        *(int *)(wh + 0x38) = height;
        *(int *)(wh + 0x48) = refreshRate;
        _glfwPlatformSetWindowMonitor
                  ((_GLFWwindow *)wh,(_GLFWmonitor *)mh,xpos,ypos,width,height,refreshRate);
      }
      return;
    }
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                  ,0x3ab,
                  "void glfwSetWindowMonitor(GLFWwindow *, GLFWmonitor *, int, int, int, int, int)")
    ;
  }
  __assert_fail("width >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                ,0x3aa,
                "void glfwSetWindowMonitor(GLFWwindow *, GLFWmonitor *, int, int, int, int, int)");
}

Assistant:

GLFWAPI void glfwSetWindowMonitor(GLFWwindow* wh,
                                  GLFWmonitor* mh,
                                  int xpos, int ypos,
                                  int width, int height,
                                  int refreshRate)
{
    _GLFWwindow* window = (_GLFWwindow*) wh;
    _GLFWmonitor* monitor = (_GLFWmonitor*) mh;
    assert(window != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT();

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);
        return;
    }

    if (refreshRate < 0 && refreshRate != GLFW_DONT_CARE)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid refresh rate %i",
                        refreshRate);
        return;
    }

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.refreshRate = refreshRate;

    _glfwPlatformSetWindowMonitor(window, monitor,
                                  xpos, ypos, width, height,
                                  refreshRate);
}